

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

format_decimal_result<wchar_t_*>
fmt::v8::detail::format_decimal<wchar_t,unsigned_long>(wchar_t *out,unsigned_long value,int size)

{
  wchar_t *pwVar1;
  undefined2 uVar2;
  bool bVar3;
  long lVar4;
  ulong uVar5;
  wchar_t *pwVar6;
  wchar_t *pwVar7;
  undefined1 uVar9;
  undefined1 auVar8 [16];
  format_decimal_result<wchar_t_*> fVar10;
  
  lVar4 = 0x3f;
  if ((value | 1) != 0) {
    for (; (value | 1) >> lVar4 == 0; lVar4 = lVar4 + -1) {
    }
  }
  if (size < (int)((uint)(byte)do_count_digits(unsigned_long)::bsr2log10[lVar4] -
                  (uint)(value < *(ulong *)(do_count_digits(unsigned_long)::zero_or_powers_of_10 +
                                           (ulong)(byte)do_count_digits(unsigned_long)::bsr2log10
                                                        [lVar4] * 8)))) {
    fmt::v8::detail::assert_fail
              ("/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/external/fmt/include/fmt/format.h"
               ,0x45e,"invalid digit count");
  }
  pwVar1 = out + size;
  uVar5 = value;
  pwVar6 = pwVar1;
  pwVar7 = pwVar1;
  if (99 < value) {
    do {
      pwVar6 = pwVar7 + -2;
      value = uVar5 / 100;
      uVar2 = *(undefined2 *)
               (
               "00010203040506070809101112131415161718192021222324252627282930313233343536373839404142434445464748495051525354555657585960616263646566676869707172737475767778798081828384858687888990919293949596979899"
               + (uVar5 % 100) * 2);
      uVar9 = (undefined1)((ushort)uVar2 >> 8);
      auVar8 = ZEXT416(CONCAT22((short)(CONCAT13(uVar9,CONCAT12(uVar9,uVar2)) >> 0x10),
                                CONCAT11((char)uVar2,(char)uVar2)));
      auVar8 = pshuflw(auVar8,auVar8,0x60);
      *(ulong *)(pwVar7 + -2) = CONCAT44(auVar8._4_4_ >> 0x18,auVar8._0_4_ >> 0x18);
      bVar3 = 9999 < uVar5;
      uVar5 = value;
      pwVar7 = pwVar6;
    } while (bVar3);
  }
  if (value < 10) {
    pwVar6[-1] = (uint)value | 0x30;
    pwVar6 = pwVar6 + -1;
  }
  else {
    uVar2 = *(undefined2 *)
             (
             "00010203040506070809101112131415161718192021222324252627282930313233343536373839404142434445464748495051525354555657585960616263646566676869707172737475767778798081828384858687888990919293949596979899"
             + value * 2);
    uVar9 = (undefined1)((ushort)uVar2 >> 8);
    auVar8 = ZEXT416(CONCAT22((short)(CONCAT13(uVar9,CONCAT12(uVar9,uVar2)) >> 0x10),
                              CONCAT11((char)uVar2,(char)uVar2)));
    auVar8 = pshuflw(auVar8,auVar8,0x60);
    *(ulong *)(pwVar6 + -2) = CONCAT44(auVar8._4_4_ >> 0x18,auVar8._0_4_ >> 0x18);
    pwVar6 = pwVar6 + -2;
  }
  fVar10.end = pwVar1;
  fVar10.begin = pwVar6;
  return fVar10;
}

Assistant:

FMT_CONSTEXPR20 auto format_decimal(Char* out, UInt value, int size)
    -> format_decimal_result<Char*> {
  FMT_ASSERT(size >= count_digits(value), "invalid digit count");
  out += size;
  Char* end = out;
  while (value >= 100) {
    // Integer division is slow so do it for a group of two digits instead
    // of for every digit. The idea comes from the talk by Alexandrescu
    // "Three Optimization Tips for C++". See speed-test for a comparison.
    out -= 2;
    copy2(out, digits2(static_cast<size_t>(value % 100)));
    value /= 100;
  }
  if (value < 10) {
    *--out = static_cast<Char>('0' + value);
    return {out, end};
  }
  out -= 2;
  copy2(out, digits2(static_cast<size_t>(value)));
  return {out, end};
}